

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str.c
# Opt level: O0

tchar_t * tcsncat_s(tchar_t *Out,size_t OutLen,tchar_t *In,size_t InLen)

{
  size_t sVar1;
  size_t n;
  size_t InLen_local;
  tchar_t *In_local;
  size_t OutLen_local;
  tchar_t *Out_local;
  
  if (In == (tchar_t *)0x0) {
    __assert_fail("In != NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/Matroska-Org[P]foundation-source/corec/corec/str/str.c"
                  ,0x84,"tchar_t *tcsncat_s(tchar_t *, size_t, const tchar_t *, size_t)");
  }
  if ((OutLen != 0) && (sVar1 = strlen(Out), sVar1 < OutLen)) {
    tcsncpy_s(Out + sVar1,OutLen - sVar1,In,InLen);
  }
  return Out;
}

Assistant:

tchar_t* tcsncat_s(tchar_t* Out,size_t OutLen,const tchar_t* In,size_t InLen)
{
    assert(In != NULL);
	if (OutLen>0)
	{
		size_t n = tcslen(Out);
        if (OutLen>n)
    		tcsncpy_s(Out+n,OutLen-n,In,InLen);
	}
    return Out;
}